

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_FuncCheckMajority(Gem_Man_t *p,int f)

{
  int nBits;
  word wVar1;
  int Mask;
  int nHalfVars;
  int Polar;
  word *pTruth;
  Gem_Obj_t *pObj;
  Gem_Man_t *pGStack_18;
  int f_local;
  Gem_Man_t *p_local;
  
  pTruth = (word *)(p->pObjs + f);
  pObj._4_4_ = f;
  pGStack_18 = p;
  _nHalfVars = Vec_MemReadEntry(p->vTtMem,f);
  Mask = Abc_TtIsFullySymmetric(_nHalfVars,(uint)*pTruth & 0xf);
  if (Mask != -1) {
    nBits = (int)(((uint)*pTruth & 0xf) + 1) >> 1;
    wVar1 = Abc_Tt6Mask(nBits);
    printf("Found symmetric %d-variable function: ",(ulong)((uint)*pTruth & 0xf));
    Extra_PrintBinary2(_stdout,(uint *)&Mask,((uint)*pTruth & 0xf) + 1);
    printf("   ");
    if (((*pTruth & 1) == 0) || (Mask != (int)wVar1 << (sbyte)nBits)) {
      printf("\n");
    }
    else {
      printf("This is majority-%d.\n",(ulong)((uint)*pTruth & 0xf));
    }
  }
  return 0;
}

Assistant:

int Gem_FuncCheckMajority( Gem_Man_t * p, int f )
{
    Gem_Obj_t * pObj = p->pObjs + f;
    word * pTruth = Vec_MemReadEntry( p->vTtMem, f );
    int Polar = Abc_TtIsFullySymmetric( pTruth, pObj->nVars );
    if ( Polar != -1 )
    {
        int nHalfVars = (pObj->nVars+1) >> 1;
        int Mask = Abc_Tt6Mask( nHalfVars );
        printf( "Found symmetric %d-variable function: ", pObj->nVars );
        Extra_PrintBinary2( stdout, (unsigned *)&Polar, pObj->nVars + 1 );
        printf( "   " );
        if ( (pObj->nVars & 1) && Polar == (Mask << nHalfVars) )
        {
            printf( "This is majority-%d.\n", pObj->nVars );
            return 0;
        }
        printf( "\n" );
    }
    return 0;
}